

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O0

void __thiscall Coverage_connectionComment_Test::TestBody(Coverage_connectionComment_Test *this)

{
  shared_ptr<libcellml::Model> local_68;
  undefined1 local_58 [8];
  ParserPtr p;
  allocator<char> local_31;
  string local_30 [8];
  string in;
  Coverage_connectionComment_Test *this_local;
  
  in.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"modelA\">\n  <component name=\"componentA\">\n    <variable name=\"variable1\" units=\"dimensionless\"/>\n  </component>\n  <connection component_1=\"component1\">\n    <!-- Comment on connection. -->\n    <map_variables variable_1=\"variable1\" variable_2=\"variable2\">\n      <!-- Comment in a map variables. -->\n    </map_variables>\n  </connection>\n</model>\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  libcellml::Parser::create
            (SUB81((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_58,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_58);
  libcellml::Parser::parseModel((string *)&local_68);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_68);
  std::shared_ptr<libcellml::Parser>::~shared_ptr((shared_ptr<libcellml::Parser> *)local_58);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Coverage, connectionComment)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"modelA\">\n"
        "  <component name=\"componentA\">\n"
        "    <variable name=\"variable1\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"component1\">\n"
        "    <!-- Comment on connection. -->\n"
        "    <map_variables variable_1=\"variable1\" variable_2=\"variable2\">\n"
        "      <!-- Comment in a map variables. -->\n"
        "    </map_variables>\n"
        "  </connection>\n"
        "</model>\n";

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);
}